

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::Value(Value *this,double v)

{
  PackedData local_58;
  Type local_30;
  double local_18;
  double v_local;
  Value *this_local;
  
  local_18 = v;
  v_local = (double)this;
  Type::Type(&local_30,float64);
  Value(this,&local_30);
  Type::~Type(&local_30);
  getData(&local_58,this);
  PackedData::setAs<double>(&local_58,local_18);
  return;
}

Assistant:

Value::Value (double   v)  : Value (Type (PrimitiveType::float64))   { getData().setAs (v); }